

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  uint64_t *puVar1;
  vec<Minisat::Lit> *ps;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  vec<unsigned_int> *pvVar5;
  int i;
  long lVar6;
  int j;
  ulong uVar7;
  ulong *puVar8;
  Var local_48;
  Lit local_44;
  vec<unsigned_int> *local_40;
  SimpSolver *local_38;
  
  if ((this->super_Solver).ok == true) {
    (this->eliminated).data[v] = '\x01';
    pcVar3 = (this->super_Solver).decision.data;
    if (pcVar3[v] != '\0') {
      puVar1 = &(this->super_Solver).dec_vars;
      *puVar1 = *puVar1 - 1;
    }
    pcVar3[v] = '\0';
    local_48 = v;
    pvVar5 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
                       (&this->occurs,&local_48);
    ps = &(this->super_Solver).add_tmp;
    local_40 = pvVar5;
    local_38 = this;
    for (lVar6 = 0; lVar6 < pvVar5->sz; lVar6 = lVar6 + 1) {
      puVar8 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                        pvVar5->data[lVar6]);
      puVar1 = &(this->super_Solver).statistics.simpSteps;
      *puVar1 = *puVar1 + 1;
      if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
        (this->super_Solver).add_tmp.sz = 0;
      }
      for (uVar7 = 0; this = local_38, uVar7 < *puVar8 >> 0x22; uVar7 = uVar7 + 1) {
        uVar2 = *(uint *)((long)puVar8 + uVar7 * 4 + 8);
        local_44.x = uVar2 & 1 ^ x.x;
        if ((int)uVar2 >> 1 != local_48) {
          local_44.x = uVar2;
        }
        vec<Minisat::Lit>::push(ps,&local_44);
      }
      bVar4 = addClause_(local_38,ps);
      pvVar5 = local_40;
      if (!bVar4) {
        (this->super_Solver).ok = false;
        goto LAB_00127d0b;
      }
      removeClause(this,local_40->data[lVar6]);
    }
    bVar4 = true;
  }
  else {
LAB_00127d0b:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef> &cls = occurs.lookup(v);

    vec<Lit> &subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++) {
        Clause &c = ca[cls[i]];
        statistics.simpSteps++;

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++) {
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

        if (!addClause_(subst_clause)) return ok = false;

        removeClause(cls[i]);
    }

    return true;
}